

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::wordModifiers(string *unit)

{
  size_type sVar1;
  array<std::tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier>,_39UL> *paVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  __tuple_element_t<2UL,_tuple<const_char_*,_const_char_*,_unsigned_long,_modifier>_> *p_Var6;
  __tuple_element_t<3UL,_tuple<const_char_*,_const_char_*,_unsigned_long,_modifier>_> *p_Var7;
  __tuple_element_t<0UL,_tuple<const_char_*,_const_char_*,_unsigned_long,_modifier>_> *ppcVar8;
  long lVar9;
  __tuple_element_t<2UL,_tuple<const_char_*,_const_char_*,_unsigned_long,_modifier>_> _Var10;
  char *pcVar11;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  undefined8 local_a8 [2];
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  undefined8 local_88;
  ulong local_80;
  size_type fnd_1;
  size_type fnd;
  allocator local_59;
  string local_58;
  tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier> *local_38;
  value_type *mod;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier>,_39UL> *__range1;
  string *unit_local;
  
  __range1 = (array<std::tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier>,_39UL> *)
             unit;
  iVar4 = std::__cxx11::string::compare((ulong)unit,0,(char *)0x3);
  if ((iVar4 != 0) &&
     (iVar4 = std::__cxx11::string::compare((ulong)__range1,0,(char *)0xd), iVar4 != 0)) {
    __begin1 = wordModifiers::modifiers._M_elems;
    __end1 = std::
             array<std::tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier>,_39UL>::
             begin(&wordModifiers::modifiers);
    mod = std::array<std::tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier>,_39UL>::
          end(&wordModifiers::modifiers);
    for (; __end1 != mod; __end1 = __end1 + 1) {
      local_38 = __end1;
      uVar5 = std::__cxx11::string::size();
      p_Var6 = std::get<2ul,char_const*,char_const*,unsigned_long,units::modifier>(local_38);
      if (*p_Var6 <= uVar5) {
        p_Var7 = std::get<3ul,char_const*,char_const*,unsigned_long,units::modifier>(local_38);
        paVar2 = __range1;
        switch(*p_Var7) {
        case start_tail:
          p_Var6 = std::get<2ul,char_const*,char_const*,unsigned_long,units::modifier>(local_38);
          pcVar11 = (char *)*p_Var6;
          std::get<0ul,char_const*,char_const*,unsigned_long,units::modifier>(local_38);
          iVar4 = std::__cxx11::string::compare((ulong)paVar2,0,pcVar11);
          if (iVar4 == 0) {
            _Var10 = std::__cxx11::string::size();
            p_Var6 = std::get<2ul,char_const*,char_const*,unsigned_long,units::modifier>(local_38);
            paVar2 = __range1;
            if (_Var10 != *p_Var6) {
              std::get<2ul,char_const*,char_const*,unsigned_long,units::modifier>(local_38);
              std::__cxx11::string::erase((ulong)paVar2,0);
              paVar2 = __range1;
              std::get<1ul,char_const*,char_const*,unsigned_long,units::modifier>(local_38);
              std::__cxx11::string::append((char *)paVar2);
              return true;
            }
            return false;
          }
          break;
        case start_replace:
          p_Var6 = std::get<2ul,char_const*,char_const*,unsigned_long,units::modifier>(local_38);
          pcVar11 = (char *)*p_Var6;
          std::get<0ul,char_const*,char_const*,unsigned_long,units::modifier>(local_38);
          iVar4 = std::__cxx11::string::compare((ulong)paVar2,0,pcVar11);
          paVar2 = __range1;
          if (iVar4 == 0) {
            p_Var6 = std::get<2ul,char_const*,char_const*,unsigned_long,units::modifier>(local_38);
            pcVar11 = (char *)*p_Var6;
            std::get<1ul,char_const*,char_const*,unsigned_long,units::modifier>(local_38);
            std::__cxx11::string::replace((ulong)paVar2,0,pcVar11);
            return true;
          }
          break;
        case anywhere_tail:
          ppcVar8 = std::get<0ul,char_const*,char_const*,unsigned_long,units::modifier>(local_38);
          uVar5 = std::__cxx11::string::find((char *)paVar2,(ulong)*ppcVar8);
          paVar2 = __range1;
          if (uVar5 != 0xffffffffffffffff) {
            local_80 = uVar5;
            if (uVar5 == 0) {
              std::get<2ul,char_const*,char_const*,unsigned_long,units::modifier>(local_38);
              std::__cxx11::string::erase((ulong)paVar2,0);
              std::__cxx11::string::push_back((char)__range1);
            }
            else {
              p_Var6 = std::get<2ul,char_const*,char_const*,unsigned_long,units::modifier>(local_38)
              ;
              std::__cxx11::string::replace((ulong)paVar2,uVar5,(char *)*p_Var6);
            }
            paVar2 = __range1;
            std::get<1ul,char_const*,char_const*,unsigned_long,units::modifier>(local_38);
            std::__cxx11::string::append((char *)paVar2);
            return true;
          }
          local_80 = 0xffffffffffffffff;
          break;
        case anywhere_replace:
          ppcVar8 = std::get<0ul,char_const*,char_const*,unsigned_long,units::modifier>(local_38);
          fnd_1 = std::__cxx11::string::find((char *)paVar2,(ulong)*ppcVar8);
          if (fnd_1 != 0xffffffffffffffff) {
            _Var10 = std::__cxx11::string::size();
            p_Var6 = std::get<2ul,char_const*,char_const*,unsigned_long,units::modifier>(local_38);
            paVar2 = __range1;
            sVar1 = fnd_1;
            if (_Var10 != *p_Var6) {
              p_Var6 = std::get<2ul,char_const*,char_const*,unsigned_long,units::modifier>(local_38)
              ;
              pcVar11 = (char *)*p_Var6;
              std::get<1ul,char_const*,char_const*,unsigned_long,units::modifier>(local_38);
              std::__cxx11::string::replace((ulong)paVar2,sVar1,pcVar11);
              return true;
            }
            return false;
          }
          fnd_1 = 0xffffffffffffffff;
          break;
        case tail_replace:
          ppcVar8 = std::get<0ul,char_const*,char_const*,unsigned_long,units::modifier>(local_38);
          pcVar11 = *ppcVar8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_58,pcVar11,&local_59);
          bVar3 = ends_with((string *)paVar2,&local_58);
          std::__cxx11::string::~string((string *)&local_58);
          std::allocator<char>::~allocator((allocator<char> *)&local_59);
          paVar2 = __range1;
          if (bVar3) {
            lVar9 = std::__cxx11::string::size();
            p_Var6 = std::get<2ul,char_const*,char_const*,unsigned_long,units::modifier>(local_38);
            _Var10 = *p_Var6;
            p_Var6 = std::get<2ul,char_const*,char_const*,unsigned_long,units::modifier>(local_38);
            pcVar11 = (char *)*p_Var6;
            std::get<1ul,char_const*,char_const*,unsigned_long,units::modifier>(local_38);
            std::__cxx11::string::replace((ulong)paVar2,lVar9 - _Var10,pcVar11);
            return true;
          }
        }
      }
    }
    pcVar11 = (char *)std::__cxx11::string::back();
    bVar3 = isDigitCharacter(*pcVar11);
    paVar2 = __range1;
    if (bVar3) {
      std::__cxx11::string::size();
      pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)paVar2);
      paVar2 = __range1;
      if (*pcVar11 == '-') {
        local_98._M_current = (char *)std::__cxx11::string::end();
        local_90 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator-(&local_98,2);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_88,&local_90);
        std::__cxx11::string::insert(paVar2,local_88,0x5e);
        return true;
      }
      std::__cxx11::string::size();
      pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)paVar2);
      bVar3 = isDigitCharacter(*pcVar11);
      paVar2 = __range1;
      if (!bVar3) {
        local_b8._M_current = (char *)std::__cxx11::string::end();
        local_b0 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator-(&local_b8,1);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)local_a8,&local_b0);
        std::__cxx11::string::insert(paVar2,local_a8[0],0x5e);
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool wordModifiers(std::string& unit)
{
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<modSeq, 39> modifiers{{
        modSeq{"reciprocalsquare", "^-2", 16, modifier::start_tail},
        modSeq{"reciprocalcubic", "^-3", 15, modifier::start_tail},
        modSeq{"squaremeter", "m^2", 11, modifier::anywhere_tail},
        modSeq{"cubicmeter", "m^3", 10, modifier::anywhere_tail},
        modSeq{"cubic", "^3", 5, modifier::start_tail},
        modSeq{"reciprocal", "^-1", 10, modifier::start_tail},
        modSeq{"reciprocal", "^-1", 10, modifier::tail_replace},
        modSeq{"square", "^2", 6, modifier::start_tail},
        modSeq{"squared", "^2", 7, modifier::start_tail},
        modSeq{"cubed", "^2", 7, modifier::start_tail},
        modSeq{"cu", "^3", 2, modifier::start_tail},
        modSeq{"sq", "^2", 2, modifier::start_tail},
        modSeq{"tenthousand", "10000", 11, modifier::anywhere_replace},
        modSeq{"tenths", "0.1", 5, modifier::anywhere_replace},
        modSeq{"tenth", "0.1", 5, modifier::anywhere_replace},
        modSeq{"ten", "10", 3, modifier::anywhere_replace},
        modSeq{"one", "", 3, modifier::start_replace},
        modSeq{"quarter", "0.25", 7, modifier::anywhere_replace},
        modSeq{"eighth", "0.125", 6, modifier::anywhere_replace},
        modSeq{"sixteenth", "0.0625", 9, modifier::anywhere_replace},
        modSeq{"thirtyseconds", "0.03125", 13, modifier::anywhere_replace},
        modSeq{"sixtyfourths", "0.015625", 12, modifier::anywhere_replace},
        modSeq{"half", "0.5", 4, modifier::anywhere_replace},
        modSeq{"hundred", "100", 7, modifier::anywhere_replace},
        modSeq{"million", "1e6", 7, modifier::anywhere_replace},
        modSeq{"billion", "1e9", 7, modifier::anywhere_replace},
        modSeq{"trillion", "1e12", 8, modifier::anywhere_replace},
        modSeq{"thousand", "1000", 8, modifier::anywhere_replace},
        modSeq{"tothethirdpower", "^3", 15, modifier::anywhere_replace},
        modSeq{"tothefourthpower", "^4", 16, modifier::anywhere_replace},
        modSeq{"tothefifthpower", "^5", 15, modifier::anywhere_replace},
        modSeq{"tothesixthpower", "^6", 15, modifier::anywhere_replace},
        modSeq{"squared", "^2", 7, modifier::anywhere_replace},
        modSeq{"cubed", "^3", 5, modifier::anywhere_replace},
        modSeq{"square", "^2", 6, modifier::anywhere_tail},
        modSeq{"cubic", "^3", 5, modifier::anywhere_tail},
        modSeq{"sq", "^2", 2, modifier::tail_replace},
        modSeq{"cu", "^3", 2, modifier::tail_replace},
        modSeq{"u", "unit", 1, modifier::tail_replace},
    }};
    if (unit.compare(0, 3, "cup") ==
        0) {  // this causes too many issues so skip it
        return false;
    }
    if (unit.compare(0, 13, "hundredweight") ==
        0) {  // this is a specific unit and should not be cut off
        return false;
    }
    for (const auto& mod : modifiers) {
        if (unit.size() < std::get<2>(mod)) {
            continue;
        }
        switch (std::get<3>(mod)) {
            case modifier::tail_replace: {
                if (ends_with(unit, std::get<0>(mod))) {
                    unit.replace(
                        unit.size() - std::get<2>(mod),
                        std::get<2>(mod),
                        std::get<1>(mod));
                    return true;
                }
                break;
            }
            case modifier::anywhere_replace: {
                auto fnd = unit.find(std::get<0>(mod));
                if (fnd != std::string::npos) {
                    if (unit.size() == std::get<2>(mod)) {
                        return false;
                    }
                    unit.replace(fnd, std::get<2>(mod), std::get<1>(mod));
                    return true;
                }
                break;
            }
            case modifier::start_tail: {
                if (unit.compare(0, std::get<2>(mod), std::get<0>(mod)) == 0) {
                    if (unit.size() == std::get<2>(mod)) {
                        return false;
                    }
                    unit.erase(0, std::get<2>(mod));
                    unit.append(std::get<1>(mod));
                    return true;
                }
                break;
                case modifier::anywhere_tail: {
                    auto fnd = unit.find(std::get<0>(mod));
                    if (fnd != std::string::npos) {
                        // this will need to be added in again if more string
                        // are added to the search list with this type if
                        // (unit.size() == std::get<2>(mod))
                        //{
                        //    return false;
                        //}
                        if (fnd != 0) {
                            unit.replace(fnd, std::get<2>(mod), "*");
                        } else {
                            unit.erase(0, std::get<2>(mod));
                            unit.push_back('*');
                        }
                        unit.append(std::get<1>(mod));
                        return true;
                    }
                }
            } break;
            case modifier::start_replace: {
                if (unit.compare(0, std::get<2>(mod), std::get<0>(mod)) == 0) {
                    unit.replace(0, std::get<2>(mod), std::get<1>(mod));
                    return true;
                }
            } break;
        }
    }

    // deal with strings if the end is a number that didn't have a ^
    if (isDigitCharacter(unit.back())) {
        if (unit[unit.size() - 2] == '-') {
            unit.insert(unit.end() - 2, '^');
            return true;
        }
        if (!isDigitCharacter(unit[unit.size() - 2])) {
            unit.insert(unit.end() - 1, '^');
            return true;
        }
    }

    return false;
}